

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O1

TestReturnValue __thiscall
embree::DisableAndDetachGeometryTest::run
          (DisableAndDetachGeometryTest *this,VerifyApplication *state,bool silent)

{
  size_type *psVar1;
  float *pfVar2;
  pointer pcVar3;
  byte bVar4;
  RTCError code;
  undefined8 *puVar5;
  RTCDevice userPtr;
  int sse2;
  RTCBuildQuality quality;
  size_t j;
  long lVar6;
  size_t i;
  ulong uVar7;
  RTCDeviceRef device;
  uint geom [4];
  string cfg;
  RTCGeometry hgeom [4];
  VerifyScene scene;
  RTCRayHit rh;
  undefined1 local_1c8 [24];
  RTCSceneRef local_1b0;
  RTCRayHit rh_1;
  undefined1 local_148 [16];
  RTCRayHit rh_3;
  RTCRayHit rh_2;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pfVar2 = &rh.ray.dir_x;
  pcVar3 = (state->super_Application).rtcore._M_dataplus._M_p;
  rh.ray._0_8_ = pfVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rh,pcVar3,pcVar3 + (state->super_Application).rtcore._M_string_length);
  std::__cxx11::string::append((char *)&rh);
  stringOfISA_abi_cxx11_((string *)&rh_1,(embree *)(ulong)(uint)(this->super_Test).sse2,sse2);
  uVar7 = 0xf;
  if ((float *)rh.ray._0_8_ != pfVar2) {
    uVar7 = rh.ray._16_8_;
  }
  if (uVar7 < (ulong)(rh_1.ray._8_8_ + rh.ray._8_8_)) {
    uVar7 = 0xf;
    if ((float *)rh_1.ray._0_8_ != &rh_1.ray.dir_x) {
      uVar7 = rh_1.ray._16_8_;
    }
    if ((ulong)(rh_1.ray._8_8_ + rh.ray._8_8_) <= uVar7) {
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&rh_1,0,(char *)0x0,rh.ray._0_8_);
      goto LAB_00143fce;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&rh,rh_1.ray._0_8_);
LAB_00143fce:
  cfg._M_dataplus._M_p = (pointer)&cfg.field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    cfg.field_2._M_allocated_capacity = *psVar1;
    cfg.field_2._8_8_ = puVar5[3];
  }
  else {
    cfg.field_2._M_allocated_capacity = *psVar1;
    cfg._M_dataplus._M_p = (pointer)*puVar5;
  }
  cfg._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(char *)psVar1 = '\0';
  if ((float *)rh_1.ray._0_8_ != &rh_1.ray.dir_x) {
    operator_delete((void *)rh_1.ray._0_8_);
  }
  if ((float *)rh.ray._0_8_ != pfVar2) {
    operator_delete((void *)rh.ray._0_8_);
  }
  userPtr = (RTCDevice)rtcNewDevice(cfg._M_dataplus._M_p);
  device.device = userPtr;
  code = rtcGetDeviceError();
  errorHandler(userPtr,code,(char *)0x0);
  VerifyScene::VerifyScene(&scene,&device,this->sflags);
  AssertNoError(device.device);
  quality = (int)this + 0x3c;
  local_48 = 0xbf800000;
  uStack_40 = 0xbf800000;
  rh.ray.org_z = 0.0;
  rh.ray.tnear = 0.0;
  rh.ray.dir_x = 0.0;
  rh.ray.dir_y = 0.0;
  rh.ray.dir_z = 0.0;
  rh.ray.time = 0.0;
  VerifyScene::addSphere
            ((VerifyScene *)hgeom,(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,
             (size_t)&local_48,0x32,(avector<Vec3fa> *)0xffffffffffffffff);
  geom[0] = (uint)hgeom[0];
  local_58 = 0xbf800000;
  uStack_50 = 0x3f800000;
  rh_1.ray.org_z = 0.0;
  rh_1.ray.tnear = 0.0;
  rh_1.ray.dir_x = 0.0;
  rh_1.ray.dir_y = 0.0;
  rh_1.ray.dir_z = 0.0;
  rh_1.ray.time = 0.0;
  VerifyScene::addQuadSphere
            ((VerifyScene *)(local_1c8 + 0x10),(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,
             (size_t)&local_58,0x32,(avector<Vec3fa> *)0xffffffffffffffff);
  geom[1] = local_1c8._16_4_;
  local_68 = 0x3f800000;
  uStack_60 = 0xbf800000;
  rh_2.ray.org_z = 0.0;
  rh_2.ray.tnear = 0.0;
  rh_2.ray.dir_x = 0.0;
  rh_2.ray.dir_y = 0.0;
  rh_2.ray.dir_z = 0.0;
  rh_2.ray.time = 0.0;
  VerifyScene::addSubdivSphere
            ((VerifyScene *)local_1c8,(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,
             (size_t)&local_68,4.0,5,(avector<Vec3fa> *)0xffffffffffffffff);
  geom[2] = local_1c8._0_4_;
  local_78 = 0x3f800000;
  uStack_70 = 0x3f800000;
  rh_3.ray.org_z = 0.0;
  rh_3.ray.tnear = 0.0;
  rh_3.ray.dir_x = 0.0;
  rh_3.ray.dir_y = 0.0;
  rh_3.ray.dir_z = 0.0;
  rh_3.ray.time = 0.0;
  VerifyScene::addHair
            ((VerifyScene *)local_148,(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,1.0,
             (size_t)&local_78,(avector<Vec3fa> *)0x1);
  geom[3] = local_148._0_4_;
  if (local_148._8_8_ != 0) {
    (**(code **)(*(long *)local_148._8_8_ + 0x18))();
  }
  alignedFree((void *)CONCAT44(rh_3.ray.time,rh_3.ray.dir_z));
  rh_3.ray.org_z = 0.0;
  rh_3.ray.tnear = 0.0;
  rh_3.ray.dir_x = 0.0;
  rh_3.ray.dir_y = 0.0;
  rh_3.ray.dir_z = 0.0;
  rh_3.ray.time = 0.0;
  if (local_1c8._8_8_ != 0) {
    (**(code **)(*(long *)local_1c8._8_8_ + 0x18))();
  }
  alignedFree((void *)CONCAT44(rh_2.ray.time,rh_2.ray.dir_z));
  rh_2.ray.org_z = 0.0;
  rh_2.ray.tnear = 0.0;
  rh_2.ray.dir_x = 0.0;
  rh_2.ray.dir_y = 0.0;
  rh_2.ray.dir_z = 0.0;
  rh_2.ray.time = 0.0;
  if (local_1b0.scene != (RTCScene)0x0) {
    (**(code **)(*(long *)local_1b0.scene + 0x18))();
  }
  alignedFree((void *)CONCAT44(rh_1.ray.time,rh_1.ray.dir_z));
  rh_1.ray.org_z = 0.0;
  rh_1.ray.tnear = 0.0;
  rh_1.ray.dir_x = 0.0;
  rh_1.ray.dir_y = 0.0;
  rh_1.ray.dir_z = 0.0;
  rh_1.ray.time = 0.0;
  if (hgeom[1] != (RTCGeometry)0x0) {
    (**(code **)(*(long *)hgeom[1] + 0x18))();
  }
  alignedFree((void *)CONCAT44(rh.ray.time,rh.ray.dir_z));
  rh.ray.org_z = 0.0;
  rh.ray.tnear = 0.0;
  rh.ray.dir_x = 0.0;
  rh.ray.dir_y = 0.0;
  rh.ray.dir_z = 0.0;
  rh.ray.time = 0.0;
  hgeom[0] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,geom[0]);
  hgeom[1] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,local_1c8._16_4_);
  hgeom[2] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,local_1c8._0_4_);
  hgeom[3] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,local_148._0_4_);
  AssertNoError(device.device);
  lVar6 = 0;
  do {
    rtcEnableGeometry(hgeom[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  rtcCommitScene(scene.scene.scene);
  AssertNoError(device.device);
  bVar4 = 1;
  uVar7 = 0;
  do {
    rh.ray.id = 0xffffffff;
    rh.hit.v = 0.0;
    rh.hit.Ng_x = 0.0;
    rh.hit.Ng_y = 0.0;
    rh.hit.Ng_z = 0.0;
    rh.hit.u = 0.0;
    rh.ray.org_x = -1.0;
    rh.ray.org_y = 10.0;
    rh.ray.org_z = -1.0;
    rh.ray.tnear = 0.0;
    rh.ray.tfar = INFINITY;
    rh.ray.dir_x = 0.0;
    rh.ray.dir_y = -1.0;
    rh.ray.dir_z = 0.0;
    rh.ray.time = 0.0;
    rh.ray.mask = 0xffffffff;
    rh.hit.primID = 0xffffffff;
    rh.hit.geomID = 0xffffffff;
    rh.hit.instID[0] = 0xffffffff;
    rh.hit.instPrimID[0] = 0xffffffff;
    rh_1.ray.id = 0xffffffff;
    rh_1.hit.v = 0.0;
    rh_1.hit.Ng_x = 0.0;
    rh_1.hit.Ng_y = 0.0;
    rh_1.hit.Ng_z = 0.0;
    rh_1.hit.u = 0.0;
    rh_1.ray.org_x = -1.0;
    rh_1.ray.org_y = 10.0;
    rh_1.ray.org_z = 1.0;
    rh_1.ray.tnear = 0.0;
    rh_1.ray.tfar = INFINITY;
    rh_1.ray.dir_x = 0.0;
    rh_1.ray.dir_y = -1.0;
    rh_1.ray.dir_z = 0.0;
    rh_1.ray.time = 0.0;
    rh_1.ray.mask = 0xffffffff;
    rh_1.hit.primID = 0xffffffff;
    rh_1.hit.geomID = 0xffffffff;
    rh_1.hit.instID[0] = 0xffffffff;
    rh_1.hit.instPrimID[0] = 0xffffffff;
    rh_2.ray.id = 0xffffffff;
    rh_2.hit.v = 0.0;
    rh_2.hit.Ng_x = 0.0;
    rh_2.hit.Ng_y = 0.0;
    rh_2.hit.Ng_z = 0.0;
    rh_2.hit.u = 0.0;
    rh_2.ray.org_x = 1.0;
    rh_2.ray.org_y = 10.0;
    rh_2.ray.org_z = -1.0;
    rh_2.ray.tnear = 0.0;
    rh_2.ray.tfar = INFINITY;
    rh_2.ray.dir_x = 0.0;
    rh_2.ray.dir_y = -1.0;
    rh_2.ray.dir_z = 0.0;
    rh_2.ray.time = 0.0;
    rh_2.ray.mask = 0xffffffff;
    rh_2.hit.primID = 0xffffffff;
    rh_2.hit.geomID = 0xffffffff;
    rh_2.hit.instID[0] = 0xffffffff;
    rh_2.hit.instPrimID[0] = 0xffffffff;
    rh_3.ray.id = 0xffffffff;
    rh_3.hit.v = 0.0;
    rh_3.hit.Ng_x = 0.0;
    rh_3.hit.Ng_y = 0.0;
    rh_3.hit.Ng_z = 0.0;
    rh_3.hit.u = 0.0;
    rh_3.ray.org_x = 1.0;
    rh_3.ray.org_y = 10.0;
    rh_3.ray.org_z = 1.0;
    rh_3.ray.tnear = 0.0;
    rh_3.ray.tfar = INFINITY;
    rh_3.ray.dir_x = 0.0;
    rh_3.ray.dir_y = -1.0;
    rh_3.ray.dir_z = 0.0;
    rh_3.ray.time = 0.0;
    rh_3.ray.mask = 0xffffffff;
    rh_3.hit.primID = 0xffffffff;
    rh_3.hit.geomID = 0xffffffff;
    rh_3.hit.instID[0] = 0xffffffff;
    rh_3.hit.instPrimID[0] = 0xffffffff;
    rtcIntersect1(scene.scene.scene,&rh,0);
    rtcIntersect1(scene.scene.scene,&rh_1,0);
    rtcIntersect1(scene.scene.scene,&rh_2,0);
    rtcIntersect1(scene.scene.scene,&rh_3,0);
    if (rh.hit.geomID == -(uint)(uVar7 != 0)) {
      if (((rh_1.hit.geomID != ((uVar7 < 2) - 1 | 1)) || (rh_2.hit.geomID != ((uVar7 < 3) - 1 | 2)))
         || (rh_3.hit.geomID != (uint)(uVar7 != 4) * 4 - 1)) goto LAB_0014460e;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      std::ostream::flush();
    }
    else {
LAB_0014460e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!",1);
      std::ostream::flush();
      bVar4 = 0;
    }
    if (uVar7 != 4) {
      rtcDisableGeometry(hgeom[uVar7]);
      AssertNoError(device.device);
      rtcDetachGeometry(scene.scene.scene,geom[uVar7]);
      AssertNoError(device.device);
      rtcCommitScene(scene.scene.scene);
      AssertNoError(device.device);
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 5) {
      AssertNoError(device.device);
      scene.super_RefCount._vptr_RefCount = (_func_int **)&PTR__VerifyScene_0026b570;
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ::~vector(&scene.nodes);
      rtcReleaseScene(scene.scene.scene);
      RTCDeviceRef::~RTCDeviceRef(&device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfg._M_dataplus._M_p != &cfg.field_2) {
        operator_delete(cfg._M_dataplus._M_p);
      }
      return (TestReturnValue)bVar4;
    }
  } while( true );
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      VerifyScene scene(device,sflags);
      AssertNoError(device);
      unsigned geom[] = {
        scene.addSphere      (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(-1,0,-1),1.0f,50).first,
        scene.addQuadSphere  (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(-1,0,+1),1.0f,50).first,
        scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(+1,0,-1),1.0f,5,4).first,
        scene.addHair        (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(+1,0,+1),1.0f,1.0f,1).first,
      };
      RTCGeometry hgeom[] = {
        rtcGetGeometry(scene,geom[0]),
        rtcGetGeometry(scene,geom[1]),
        rtcGetGeometry(scene,geom[2]),
        rtcGetGeometry(scene,geom[3]),
      };
      AssertNoError(device);

      for (size_t j=0; j<4; ++j)
      {
        rtcEnableGeometry(hgeom[j]);
      }
      rtcCommitScene (scene);
      AssertNoError(device);

      bool allOk = true;
      for (size_t i=0; i<5; i++)
      {
        RTCRayHit ray0 = makeRay(Vec3fa(-1,10,-1),Vec3fa(0,-1,0));
        RTCRayHit ray1 = makeRay(Vec3fa(-1,10,+1),Vec3fa(0,-1,0));
        RTCRayHit ray2 = makeRay(Vec3fa(+1,10,-1),Vec3fa(0,-1,0));
        RTCRayHit ray3 = makeRay(Vec3fa(+1,10,+1),Vec3fa(0,-1,0));
        rtcIntersect1(scene,&ray0);
        rtcIntersect1(scene,&ray1);
        rtcIntersect1(scene,&ray2);
        rtcIntersect1(scene,&ray3);
        bool ok0 = i<=0 ? ray0.hit.geomID == 0 : ray0.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok1 = i<=1 ? ray1.hit.geomID == 1 : ray1.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok2 = i<=2 ? ray2.hit.geomID == 2 : ray2.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok3 = i<=3 ? ray3.hit.geomID == 3 : ray3.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        if (!ok0 || !ok1 || !ok2 || !ok3)
        {
          std::cout << "!" << std::flush;
          allOk = false;
        }
        else
        {
          std::cout << "." << std::flush;
        }

        if (i<4)
        {
          rtcDisableGeometry(hgeom[i]);
          AssertNoError(device);
          rtcDetachGeometry(scene,geom[i]);
          AssertNoError(device);
          rtcCommitScene (scene);
          AssertNoError(device);
        }
      }
      AssertNoError(device);

      if (allOk)
        return VerifyApplication::PASSED;
      else
        return VerifyApplication::FAILED;
    }